

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O2

void av1_rd_stats_subtraction(int mult,RD_STATS *left,RD_STATS *right,RD_STATS *result)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  int rate;
  
  if ((((left->rate == 0x7fffffff) || (right->rate == 0x7fffffff)) ||
      (lVar2 = left->dist, lVar2 == 0x7fffffffffffffff)) ||
     (((lVar1 = right->dist, lVar1 == 0x7fffffffffffffff || (left->rdcost == 0x7fffffffffffffff)) ||
      (right->rdcost == 0x7fffffffffffffff)))) {
    result->rate = 0x7fffffff;
    result->zero_rate = 0;
    result->dist = 0x7fffffffffffffff;
    result->rdcost = 0x7fffffffffffffff;
    result->sse = 0x7fffffffffffffff;
    result->skip_txfm = '\0';
  }
  else {
    rate = left->rate - right->rate;
    result->rate = rate;
    lVar2 = lVar2 - lVar1;
    result->dist = lVar2;
    iVar3 = av1_calculate_rd_cost(mult,rate,lVar2);
    result->rdcost = iVar3;
  }
  return;
}

Assistant:

static inline void av1_rd_stats_subtraction(int mult,
                                            const RD_STATS *const left,
                                            const RD_STATS *const right,
                                            RD_STATS *result) {
  if (left->rate == INT_MAX || right->rate == INT_MAX ||
      left->dist == INT64_MAX || right->dist == INT64_MAX ||
      left->rdcost == INT64_MAX || right->rdcost == INT64_MAX) {
    av1_invalid_rd_stats(result);
  } else {
    result->rate = left->rate - right->rate;
    result->dist = left->dist - right->dist;
    result->rdcost = av1_calculate_rd_cost(mult, result->rate, result->dist);
  }
}